

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

int __thiscall
gl4cts::SparseTexture2AllocationTestCase::init
          (SparseTexture2AllocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  reference pvVar2;
  int local_1c [3];
  
  SparseTextureAllocationTestCase::init(&this->super_SparseTextureAllocationTestCase,ctx);
  this_00 = &(this->super_SparseTextureAllocationTestCase).mSupportedTargets;
  piVar1 = (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_SparseTextureAllocationTestCase).mSupportedTargets.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar1) {
    (this->super_SparseTextureAllocationTestCase).mSupportedTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar1
    ;
  }
  local_1c[2] = 0x9100;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,local_1c + 2);
  local_1c[1] = 0x9102;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,local_1c + 1);
  piVar1 = (this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar1) {
    (this->super_SparseTextureAllocationTestCase).mFullArrayTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar1
    ;
  }
  local_1c[0] = 0x9102;
  pvVar2 = std::vector<int,_std::allocator<int>_>::emplace_back<int>
                     (&(this->super_SparseTextureAllocationTestCase).mFullArrayTargets,local_1c);
  return (int)pvVar2;
}

Assistant:

void SparseTexture2AllocationTestCase::init()
{
	SparseTextureAllocationTestCase::init();

	mSupportedTargets.clear();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	mFullArrayTargets.clear();
	mFullArrayTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}